

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadCustomMultiple::LoadGetStateBlock_x(ChLoadCustomMultiple *this,ChState *mD)

{
  pointer psVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  int i;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  uVar5 = 0;
  iVar4 = 0;
  while( true ) {
    psVar1 = (this->loadables).
             super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->loadables).
                      super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar6);
    (**(code **)(*plVar2 + 0x20))(plVar2,iVar4,mD);
    iVar3 = (**(code **)(**(long **)((long)&(((this->loadables).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar6) + 0x10))();
    iVar4 = iVar4 + iVar3;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void ChLoadCustomMultiple::LoadGetStateBlock_x(ChState& mD) {
    int ndoftot = 0;
    for (int i = 0; i < loadables.size(); ++i) {
        loadables[i]->LoadableGetStateBlock_x(ndoftot, mD);
        ndoftot += loadables[i]->LoadableGet_ndof_x();
    }
}